

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2convex_hull_query.cc
# Opt level: O2

void __thiscall S2ConvexHullQuery::AddLoop(S2ConvexHullQuery *this,S2Loop *loop)

{
  int iVar1;
  S2Point *__x;
  int i;
  int i_00;
  S2LatLngRect local_70;
  S2LatLngRect local_48;
  
  local_70.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_00305080;
  local_70.lat_.bounds_.c_[0] = (loop->bound_).lat_.bounds_.c_[0];
  local_70.lat_.bounds_.c_[1] = (loop->bound_).lat_.bounds_.c_[1];
  local_70.lng_.bounds_.c_[0] = (loop->bound_).lng_.bounds_.c_[0];
  local_70.lng_.bounds_.c_[1] = (loop->bound_).lng_.bounds_.c_[1];
  S2LatLngRect::Union(&local_48,&this->bound_,&local_70);
  (this->bound_).lng_.bounds_.c_[0] = local_48.lng_.bounds_.c_[0];
  (this->bound_).lng_.bounds_.c_[1] = local_48.lng_.bounds_.c_[1];
  (this->bound_).lat_.bounds_.c_[0] = local_48.lat_.bounds_.c_[0];
  (this->bound_).lat_.bounds_.c_[1] = local_48.lat_.bounds_.c_[1];
  iVar1 = loop->num_vertices_;
  if (iVar1 != 1) {
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      __x = S2Loop::vertex(loop,i_00);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&this->points_,__x)
      ;
      iVar1 = loop->num_vertices_;
    }
  }
  return;
}

Assistant:

void S2ConvexHullQuery::AddLoop(const S2Loop& loop) {
  bound_ = bound_.Union(loop.GetRectBound());
  if (loop.is_empty_or_full()) {
    // The empty and full loops consist of a single fake "vertex" that should
    // not be added to our point collection.
    return;
  }
  for (int i = 0; i < loop.num_vertices(); ++i) {
    points_.push_back(loop.vertex(i));
  }
}